

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void insert_rnd_value_of<A,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>,std::uniform_real_distribution<double>>
               (vec_collection *v,
               mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
               *gen,uniform_real_distribution<double> *rnd)

{
  value_type local_28;
  uniform_real_distribution<double> *local_20;
  uniform_real_distribution<double> *rnd_local;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *gen_local;
  vec_collection *v_local;
  
  local_20 = rnd;
  rnd_local = (uniform_real_distribution<double> *)gen;
  gen_local = (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
               *)v;
  std::uniform_real_distribution<double>::operator()(rnd,gen);
  std::make_unique<A,double>((double *)&local_28);
  std::
  vector<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
  ::push_back(v,&local_28);
  std::unique_ptr<A,_std::default_delete<A>_>::~unique_ptr(&local_28);
  return;
}

Assistant:

void insert_rnd_value_of( vec_collection& v, E& gen, R& rnd)
{
	v.push_back(std::make_unique<T>( rnd(gen) ));
}